

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-objdump.cc
# Opt level: O0

Result dump_file(char *filename)

{
  bool bVar1;
  Result RVar2;
  uchar *data_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  string_view filename_00;
  undefined1 local_258 [8];
  ObjdumpState state;
  size_t size;
  uint8_t *data;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  Enum local_34;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  char *filename_local;
  Result result;
  
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)filename;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,
             (char *)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  filename_00._M_str = local_30;
  filename_00._M_len = (size_t)local_48._M_str;
  local_34 = (Enum)wabt::ReadFile((wabt *)local_48._M_len,filename_00,in_RCX);
  bVar1 = wabt::Failed((Result)local_34);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&filename_local + 4),Error);
  }
  else {
    data_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    state.function_param_counts._M_t._M_impl.super__Rb_tree_header._M_node_count =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    s_objdump_options.filename =
         (char *)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
    printf("\n");
    wabt::ObjdumpState::ObjdumpState((ObjdumpState *)local_258);
    wabt::Result::Result((Result *)((long)&filename_local + 4),Ok);
    s_objdump_options.mode = Prepass;
    RVar2 = wabt::ReadBinaryObjdump
                      (data_00,state.function_param_counts._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count,&s_objdump_options,(ObjdumpState *)local_258);
    wabt::Result::operator|=((Result *)((long)&filename_local + 4),RVar2);
    s_objdump_options.log_stream = (Stream *)0x0;
    if ((s_objdump_options.headers & 1U) != 0) {
      s_objdump_options.mode = Headers;
      RVar2 = wabt::ReadBinaryObjdump
                        (data_00,state.function_param_counts._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count,&s_objdump_options,(ObjdumpState *)local_258);
      wabt::Result::operator|=((Result *)((long)&filename_local + 4),RVar2);
    }
    if ((s_objdump_options.details & 1U) != 0) {
      s_objdump_options.mode = Details;
      RVar2 = wabt::ReadBinaryObjdump
                        (data_00,state.function_param_counts._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count,&s_objdump_options,(ObjdumpState *)local_258);
      wabt::Result::operator|=((Result *)((long)&filename_local + 4),RVar2);
    }
    if ((s_objdump_options.disassemble & 1U) != 0) {
      s_objdump_options.mode = Disassemble;
      RVar2 = wabt::ReadBinaryObjdump
                        (data_00,state.function_param_counts._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count,&s_objdump_options,(ObjdumpState *)local_258);
      wabt::Result::operator|=((Result *)((long)&filename_local + 4),RVar2);
    }
    if ((s_objdump_options.raw & 1U) != 0) {
      s_objdump_options.mode = RawData;
      RVar2 = wabt::ReadBinaryObjdump
                        (data_00,state.function_param_counts._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count,&s_objdump_options,(ObjdumpState *)local_258);
      wabt::Result::operator|=((Result *)((long)&filename_local + 4),RVar2);
    }
    wabt::ObjdumpState::~ObjdumpState((ObjdumpState *)local_258);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return (Result)filename_local._4_4_;
}

Assistant:

Result dump_file(const char* filename) {
  std::vector<uint8_t> file_data;
  CHECK_RESULT(ReadFile(filename, &file_data));

  uint8_t* data = file_data.data();
  size_t size = file_data.size();

  // Perform serveral passed over the binary in order to print out different
  // types of information.
  s_objdump_options.filename = filename;
  printf("\n");

  ObjdumpState state;

  Result result = Result::Ok;

  // Pass 0: Prepass
  s_objdump_options.mode = ObjdumpMode::Prepass;
  result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  s_objdump_options.log_stream = nullptr;

  // Pass 1: Print the section headers
  if (s_objdump_options.headers) {
    s_objdump_options.mode = ObjdumpMode::Headers;
    result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  }

  // Pass 2: Print extra information based on section type
  if (s_objdump_options.details) {
    s_objdump_options.mode = ObjdumpMode::Details;
    result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  }

  // Pass 3: Disassemble code section
  if (s_objdump_options.disassemble) {
    s_objdump_options.mode = ObjdumpMode::Disassemble;
    result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  }

  // Pass 4: Dump to raw contents of the sections
  if (s_objdump_options.raw) {
    s_objdump_options.mode = ObjdumpMode::RawData;
    result |= ReadBinaryObjdump(data, size, &s_objdump_options, &state);
  }

  return result;
}